

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.h
# Opt level: O2

void __thiscall
spvtools::opt::InstructionFolder::InstructionFolder(InstructionFolder *this,IRContext *context)

{
  ConstantFoldingRules *this_00;
  FoldingRules *this_01;
  
  this->context_ = context;
  this_00 = (ConstantFoldingRules *)::operator_new(0x90);
  ConstantFoldingRules::ConstantFoldingRules(this_00,context);
  (this->const_folding_rules_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl = this_00;
  this_01 = (FoldingRules *)::operator_new(0x90);
  FoldingRules::FoldingRules(this_01,context);
  (this->folding_rules_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
  .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl = this_01;
  (*this_01->_vptr_FoldingRules[2])(this_01);
  (*((this->const_folding_rules_)._M_t.
     super___uniq_ptr_impl<spvtools::opt::ConstantFoldingRules,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
     ._M_t.
     super__Tuple_impl<0UL,_spvtools::opt::ConstantFoldingRules_*,_std::default_delete<spvtools::opt::ConstantFoldingRules>_>
     .super__Head_base<0UL,_spvtools::opt::ConstantFoldingRules_*,_false>._M_head_impl)->
    _vptr_ConstantFoldingRules[2])();
  return;
}

Assistant:

explicit InstructionFolder(IRContext* context)
      : context_(context),
        const_folding_rules_(new ConstantFoldingRules(context)),
        folding_rules_(new FoldingRules(context)) {
    folding_rules_->AddFoldingRules();
    const_folding_rules_->AddFoldingRules();
  }